

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O0

void __thiscall SpookyHash::Update(SpookyHash *this,void *message,size_t length)

{
  byte bVar1;
  uint64 *s11;
  size_t in_RDX;
  uint64 *in_RSI;
  uint64 *in_RDI;
  uint8 prefix;
  uint64 *end;
  anon_union_8_3_837c87a1 u;
  uint8 remainder;
  size_t newLength;
  uint64 h11;
  uint64 h10;
  uint64 h9;
  uint64 h8;
  uint64 h7;
  uint64 h6;
  uint64 h5;
  uint64 h4;
  uint64 h3;
  uint64 h2;
  uint64 h1;
  uint64 h0;
  uint64 *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  byte in_stack_ffffffffffffff47;
  uint64 *in_stack_ffffffffffffff48;
  uint64 *s8;
  uint64 *puVar2;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  uint64 local_98;
  uint64 local_90;
  uint64 local_88;
  uint64 local_80;
  uint64 local_78;
  uint64 local_70;
  uint64 local_68;
  uint64 local_60;
  uint64 local_58;
  uint64 local_50;
  uint64 local_48;
  uint64 local_40;
  size_t local_38;
  uint64 *local_30;
  
  s11 = (uint64 *)(in_RDX + (byte)in_RDI[0x25]);
  local_38 = in_RDX;
  if (s11 < (uint64 *)0xc0) {
    memcpy((void *)((long)in_RDI + (ulong)(byte)in_RDI[0x25]),in_RSI,in_RDX);
    in_RDI[0x24] = local_38 + in_RDI[0x24];
    *(char *)(in_RDI + 0x25) = (char)s11;
  }
  else {
    if (in_RDI[0x24] < 0xc0) {
      local_88 = in_RDI[0x18];
      local_90 = in_RDI[0x19];
      local_98 = 0xdeadbeefdeadbeef;
      local_80 = 0xdeadbeefdeadbeef;
      local_68 = 0xdeadbeefdeadbeef;
      local_50 = 0xdeadbeefdeadbeef;
      local_78 = local_90;
      local_70 = local_88;
      local_60 = local_90;
      local_58 = local_88;
      local_48 = local_90;
      local_40 = local_88;
    }
    else {
      local_40 = in_RDI[0x18];
      local_48 = in_RDI[0x19];
      local_50 = in_RDI[0x1a];
      local_58 = in_RDI[0x1b];
      local_60 = in_RDI[0x1c];
      local_68 = in_RDI[0x1d];
      local_70 = in_RDI[0x1e];
      local_78 = in_RDI[0x1f];
      local_80 = in_RDI[0x20];
      local_88 = in_RDI[0x21];
      local_90 = in_RDI[0x22];
      local_98 = in_RDI[0x23];
    }
    in_RDI[0x24] = in_RDX + in_RDI[0x24];
    if ((char)in_RDI[0x25] != '\0') {
      in_stack_ffffffffffffff47 = -(char)in_RDI[0x25] - 0x40;
      local_30 = in_RSI;
      memcpy((void *)((long)in_RDI + (ulong)(byte)in_RDI[0x25]),in_RSI,
             (ulong)in_stack_ffffffffffffff47);
      puVar2 = in_RDI;
      Mix(&local_90,&local_88,&local_80,&local_78,&local_70,&local_68,in_stack_ffffffffffffff30,
          in_RDI,(uint64 *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
          in_stack_ffffffffffffff48,in_RDI,
          (uint64 *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),s11);
      Mix(&local_90,&local_88,&local_80,&local_78,&local_70,&local_68,in_stack_ffffffffffffff30,
          in_RDI,(uint64 *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
          in_stack_ffffffffffffff48,puVar2,
          (uint64 *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),s11);
      in_RSI = (uint64 *)((long)local_30 + (long)(int)(uint)in_stack_ffffffffffffff47);
      local_38 = local_38 - in_stack_ffffffffffffff47;
    }
    s8 = in_RSI + (local_38 / 0x60) * 0xc;
    bVar1 = (char)local_38 - ((char)s8 - (char)in_RSI);
    for (puVar2 = in_RSI; puVar2 < s8; puVar2 = puVar2 + 0xc) {
      Mix(&local_90,&local_88,&local_80,&local_78,&local_70,&local_68,in_RSI,in_RDI,
          (uint64 *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),s8,puVar2,
          (uint64 *)CONCAT17(bVar1,in_stack_ffffffffffffff58),s11);
    }
    *(byte *)(in_RDI + 0x25) = bVar1;
    memcpy(in_RDI,s8,(ulong)bVar1);
    in_RDI[0x18] = local_40;
    in_RDI[0x19] = local_48;
    in_RDI[0x1a] = local_50;
    in_RDI[0x1b] = local_58;
    in_RDI[0x1c] = local_60;
    in_RDI[0x1d] = local_68;
    in_RDI[0x1e] = local_70;
    in_RDI[0x1f] = local_78;
    in_RDI[0x20] = local_80;
    in_RDI[0x21] = local_88;
    in_RDI[0x22] = local_90;
    in_RDI[0x23] = local_98;
  }
  return;
}

Assistant:

void SpookyHash::Update(const void *message, size_t length)
{
    uint64 h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11;
    size_t newLength = length + m_remainder;
    uint8  remainder;
    union 
    { 
        const uint8 *p8; 
        uint64 *p64; 
        size_t i; 
    } u;
    const uint64 *end;
    
    // Is this message fragment too short?  If it is, stuff it away.
    if (newLength < sc_bufSize)
    {
        memcpy(&((uint8 *)m_data)[m_remainder], message, length);
        m_length = length + m_length;
        m_remainder = (uint8)newLength;
        return;
    }
    
    // init the variables
    if (m_length < sc_bufSize)
    {
        h0=h3=h6=h9  = m_state[0];
        h1=h4=h7=h10 = m_state[1];
        h2=h5=h8=h11 = sc_const;
    }
    else
    {
        h0 = m_state[0];
        h1 = m_state[1];
        h2 = m_state[2];
        h3 = m_state[3];
        h4 = m_state[4];
        h5 = m_state[5];
        h6 = m_state[6];
        h7 = m_state[7];
        h8 = m_state[8];
        h9 = m_state[9];
        h10 = m_state[10];
        h11 = m_state[11];
    }
    m_length = length + m_length;
    
    // if we've got anything stuffed away, use it now
    if (m_remainder)
    {
        uint8 prefix = sc_bufSize-m_remainder;
        memcpy(&(((uint8 *)m_data)[m_remainder]), message, prefix);
        u.p64 = m_data;
        Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        Mix(&u.p64[sc_numVars], h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        u.p8 = ((const uint8 *)message) + prefix;
        length -= prefix;
    }
    else
    {
        u.p8 = (const uint8 *)message;
    }
    
    // handle all whole blocks of sc_blockSize bytes
    end = u.p64 + (length/sc_blockSize)*sc_numVars;
    remainder = (uint8)(length-((const uint8 *)end-u.p8));
    if (ALLOW_UNALIGNED_READS || (u.i & 0x7) == 0)
    {
        while (u.p64 < end)
        { 
            Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }
    else
    {
        while (u.p64 < end)
        { 
            memcpy(m_data, u.p8, sc_blockSize);
            Mix(m_data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }

    // stuff away the last few bytes
    m_remainder = remainder;
    memcpy(m_data, end, remainder);
    
    // stuff away the variables
    m_state[0] = h0;
    m_state[1] = h1;
    m_state[2] = h2;
    m_state[3] = h3;
    m_state[4] = h4;
    m_state[5] = h5;
    m_state[6] = h6;
    m_state[7] = h7;
    m_state[8] = h8;
    m_state[9] = h9;
    m_state[10] = h10;
    m_state[11] = h11;
}